

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newmem.c
# Opt level: O0

void * talloc_struct(long nStructSize)

{
  basic_string_view<char,_std::char_traits<char>_> *in_RDI;
  CLogger *unaff_retaddr;
  string_view in_stack_00000008;
  char *tStrNew;
  int in_stack_0000122c;
  long in_stack_00001230;
  long in_stack_00001238;
  OBJ_DATA *in_stack_00001240;
  CHAR_DATA *in_stack_00001248;
  char *in_stack_00001250;
  char *in_stack_ffffffffffffffe8;
  void *local_8;
  
  if (talloc_struct::tStrPtr == (void *)0x0) {
    talloc_struct::tStrPtr = init_temp_struct_mem();
    talloc_struct::tStrBase = talloc_struct::tStrPtr;
  }
  if (talloc_struct::tStrPtr == (void *)0x0) {
    local_8 = (void *)0x0;
  }
  else if ((long)in_RDI < 0x186a1) {
    if (99999 < (long)&in_RDI->_M_len + talloc_struct::tStrMem) {
      wiznet(in_stack_00001250,in_stack_00001248,in_stack_00001240,in_stack_00001238,
             in_stack_00001230,in_stack_0000122c);
      talloc_struct::tStrPtr = talloc_struct::tStrBase;
      talloc_struct::tStrMem = 0;
    }
    talloc_struct::tStrMem = (long)&in_RDI->_M_len + talloc_struct::tStrMem;
    local_8 = talloc_struct::tStrPtr;
    talloc_struct::tStrPtr = (void *)((long)talloc_struct::tStrPtr + (long)in_RDI);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_RDI,in_stack_ffffffffffffffe8);
    CLogger::Warn<>(unaff_retaddr,in_stack_00000008);
    local_8 = (void *)0x0;
  }
  return local_8;
}

Assistant:

void *talloc_struct(long nStructSize)
{
	static long tStrMem = 0;
	static void *tStrPtr = nullptr, *tStrBase;
	char *tStrNew; 
 
	if(!tStrPtr) {
		tStrPtr = init_temp_struct_mem();
		tStrBase = tStrPtr;
	}
	if(!tStrPtr)
		return nullptr;
	if(nStructSize > TEMP_STRUCT_MEM_SIZE)
	{
		RS.Logger.Warn("Error: Temp struct too large.");
		return nullptr;
	}
	if(tStrMem + nStructSize >= TEMP_STRUCT_MEM_SIZE)
	{       //current loc + new struct is over limit, go back around the mulberry bush
		wiznet("Temporary struct allocation space allotted, returning to origination.",nullptr,nullptr,WIZ_LOG,0,0);
		tStrPtr = tStrBase;
		tStrMem = 0;
	}
	tStrNew = (char *)tStrPtr;
	tStrPtr = (void *)((char *)tStrPtr + nStructSize);
	tStrMem = tStrMem + nStructSize;
	return tStrNew;
}